

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O2

void __thiscall OpenMD::RestReader::readStuntDoubles(RestReader *this,istream *inputStream)

{
  char *__s;
  long lVar1;
  long *plVar2;
  string line;
  allocator<char> local_41;
  string local_40;
  
  __s = this->buffer;
  std::istream::getline((char *)inputStream,(long)__s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  lVar1 = std::__cxx11::string::find((char *)&local_40,0x244dbb);
  if (lVar1 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"Doubles>\n",10);
    builtin_strncpy(painCave.errMsg + 0x10,": Missing <Stunt",0x10);
    builtin_strncpy(painCave.errMsg,"RestReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  while( true ) {
    plVar2 = (long *)std::istream::getline((char *)inputStream,(long)__s);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::assign((char *)&local_40);
    lVar1 = std::__cxx11::string::find((char *)&local_40,0x244df4);
    if (lVar1 != -1) break;
    parseDumpLine(this,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void RestReader::readStuntDoubles(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<StuntDoubles>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Missing <StuntDoubles>\n");
      painCave.isFatal = 1;
      simError();
    }

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</StuntDoubles>") != std::string::npos) { break; }

      parseDumpLine(line);
    }
  }